

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_func.cpp
# Opt level: O0

unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_> __thiscall
pfederc::Parser::parseFunctionBody(Parser *this)

{
  bool bVar1;
  bool bVar2;
  TokenType TVar3;
  Token *pTVar4;
  Position *pPVar5;
  pointer pEVar6;
  Parser *in_RSI;
  bool local_139;
  Position local_120;
  undefined1 local_108 [40];
  string local_e0;
  int local_bc;
  ReturnControlType rct;
  unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> returnExpr;
  size_t sStack_a8;
  size_t local_a0;
  Position local_90;
  undefined1 local_78 [24];
  undefined1 local_60 [8];
  unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> expr;
  Exprs exprs;
  undefined1 auStack_38 [7];
  bool err;
  Position pos;
  Parser *this_local;
  
  pTVar4 = Lexer::getCurrentToken(in_RSI->lexer);
  pPVar5 = Token::getPosition(pTVar4);
  Position::Position((Position *)auStack_38,pPVar5);
  bVar1 = false;
  std::
  vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
  ::vector((vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
            *)&expr);
LAB_00133968:
  do {
    pTVar4 = Lexer::getCurrentToken(in_RSI->lexer);
    bVar2 = Token::operator!=(pTVar4,TOK_KW_RET);
    local_139 = false;
    if (bVar2) {
      pTVar4 = Lexer::getCurrentToken(in_RSI->lexer);
      bVar2 = Token::operator!=(pTVar4,TOK_STMT);
      local_139 = false;
      if (bVar2) {
        pTVar4 = Lexer::getCurrentToken(in_RSI->lexer);
        bVar2 = Token::operator!=(pTVar4,TOK_EOF);
        local_139 = false;
        if (bVar2) {
          pTVar4 = Lexer::getCurrentToken(in_RSI->lexer);
          local_139 = Token::operator!=(pTVar4,TOK_KW_ELSE);
        }
      }
    }
    if (local_139 == false) {
      std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>::
      unique_ptr<std::default_delete<pfederc::Expr>,void>
                ((unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>> *)
                 &stack0xffffffffffffff48);
      local_bc = 0;
      pTVar4 = Lexer::getCurrentToken(in_RSI->lexer);
      bVar2 = Token::operator==(pTVar4,TOK_KW_RET);
      if (bVar2) {
LAB_00133d08:
        pTVar4 = Lexer::getCurrentToken(in_RSI->lexer);
        TVar3 = Token::getType(pTVar4);
        if (TVar3 == TOK_KW_RET) {
          local_bc = 1;
        }
        else if (TVar3 == TOK_KW_CTN) {
          local_bc = 2;
        }
        else if (TVar3 == TOK_KW_BRK) {
          local_bc = 3;
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_e0,"Return control is neither ret, ctn or brk.",
                     (allocator<char> *)(local_108 + 0x27));
          fatal("/workspace/llm4binary/github/license_all_cmakelists_25/federlang[P]pfederc/libs/pfederc_syntax/src/syntax_func.cpp"
                ,0x163,&local_e0);
          std::__cxx11::string::~string((string *)&local_e0);
          std::allocator<char>::~allocator((allocator<char> *)(local_108 + 0x27));
        }
        pTVar4 = Lexer::getCurrentToken(in_RSI->lexer);
        pPVar5 = Token::getPosition(pTVar4);
        Position::operator+((Position *)(local_108 + 8),(Position *)auStack_38,pPVar5);
        _auStack_38 = (Expr *)local_108._8_8_;
        pos.line = local_108._16_8_;
        pos.startIndex = local_108._24_8_;
        Lexer::next(in_RSI->lexer);
        if (local_bc == 1) {
LAB_00133ea4:
          parseExpression((Parser *)local_108,(Precedence)in_RSI);
          std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::operator=
                    ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)
                     &stack0xffffffffffffff48,
                     (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)local_108);
          std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::~unique_ptr
                    ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)local_108);
          bVar2 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&stack0xffffffffffffff48);
          if (bVar2) {
            pEVar6 = std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::operator->
                               ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)
                                &stack0xffffffffffffff48);
            pPVar5 = Expr::getPosition(pEVar6);
            Position::operator+(&local_120,(Position *)auStack_38,pPVar5);
            _auStack_38 = (Expr *)local_120.line;
            pos.line = local_120.startIndex;
            pos.startIndex = local_120.endIndex;
          }
          else {
            bVar1 = true;
          }
        }
        else {
          pTVar4 = Lexer::getCurrentToken(in_RSI->lexer);
          bVar2 = Token::operator!=(pTVar4,TOK_EOF);
          if (bVar2) {
            pTVar4 = Lexer::getCurrentToken(in_RSI->lexer);
            bVar2 = Token::operator!=(pTVar4,TOK_EOL);
            if (bVar2) {
              pTVar4 = Lexer::getCurrentToken(in_RSI->lexer);
              bVar2 = Token::operator!=(pTVar4,TOK_STMT);
              if (bVar2) goto LAB_00133ea4;
            }
          }
        }
      }
      else {
        pTVar4 = Lexer::getCurrentToken(in_RSI->lexer);
        bVar2 = Token::operator==(pTVar4,TOK_KW_CTN);
        if (bVar2) goto LAB_00133d08;
        pTVar4 = Lexer::getCurrentToken(in_RSI->lexer);
        bVar2 = Token::operator==(pTVar4,TOK_KW_BRK);
        if (bVar2) goto LAB_00133d08;
      }
      skipEol(in_RSI);
      if (bVar1) {
        std::unique_ptr<pfederc::BodyExpr,std::default_delete<pfederc::BodyExpr>>::
        unique_ptr<std::default_delete<pfederc::BodyExpr>,void>
                  ((unique_ptr<pfederc::BodyExpr,std::default_delete<pfederc::BodyExpr>> *)this,
                   (nullptr_t)0x0);
      }
      else {
        std::
        make_unique<pfederc::BodyExpr,pfederc::Lexer&,pfederc::Position&,std::vector<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::allocator<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>>,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,pfederc::ReturnControlType&>
                  ((Lexer *)this,(Position *)in_RSI->lexer,
                   (vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
                    *)auStack_38,&expr,(ReturnControlType *)&stack0xffffffffffffff48);
      }
      std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::~unique_ptr
                ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)
                 &stack0xffffffffffffff48);
      goto LAB_00133fae;
    }
    pTVar4 = Lexer::getCurrentToken(in_RSI->lexer);
    bVar2 = Token::operator==(pTVar4,TOK_EOL);
    if (bVar2) {
      Lexer::next(in_RSI->lexer);
      goto LAB_00133968;
    }
    parseExpression((Parser *)local_60,(Precedence)in_RSI);
    pTVar4 = Lexer::getCurrentToken(in_RSI->lexer);
    bVar2 = Token::operator!=(pTVar4,TOK_STMT);
    if (bVar2) {
      pTVar4 = Lexer::getCurrentToken(in_RSI->lexer);
      bVar2 = Token::operator!=(pTVar4,TOK_EOL);
      if (!bVar2) goto LAB_00133b24;
      local_78._6_2_ = 2;
      local_78._0_4_ = 0xf;
      pTVar4 = Lexer::getCurrentToken(in_RSI->lexer);
      Token::getPosition(pTVar4);
      std::
      make_unique<pfederc::Error<pfederc::SyntaxErrorCode>,pfederc::Level,pfederc::SyntaxErrorCode,pfederc::Position_const&>
                ((Level *)(local_78 + 8),(SyntaxErrorCode *)(local_78 + 6),(Position *)local_78);
      generateError((Parser *)(local_78 + 0x10),
                    (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                     *)in_RSI);
      std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
                ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
                 (local_78 + 0x10));
      std::
      unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
      ::~unique_ptr((unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                     *)(local_78 + 8));
      skipToStmtEol(in_RSI);
      bVar1 = true;
LAB_00133bec:
      expect(in_RSI,TOK_EOL);
      bVar2 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)local_60);
      if (bVar2) {
        pEVar6 = std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::operator->
                           ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)
                            local_60);
        pPVar5 = Expr::getPosition(pEVar6);
        Position::operator+((Position *)&returnExpr,(Position *)auStack_38,pPVar5);
        pos.startIndex = local_a0;
        _auStack_38 = (Expr *)returnExpr._M_t.
                              super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>
                              .super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl;
        pos.line = sStack_a8;
        std::
        vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
        ::push_back((vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
                     *)&expr,(unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)
                             local_60);
      }
      else {
        bVar1 = true;
      }
      bVar2 = false;
    }
    else {
LAB_00133b24:
      pTVar4 = Lexer::getCurrentToken(in_RSI->lexer);
      bVar2 = Token::operator==(pTVar4,TOK_STMT);
      if ((!bVar2) ||
         (bVar2 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)local_60), !bVar2))
      goto LAB_00133bec;
      pEVar6 = std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::operator->
                         ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)local_60
                         );
      pPVar5 = Expr::getPosition(pEVar6);
      Position::operator+(&local_90,(Position *)auStack_38,pPVar5);
      pos.startIndex = local_90.endIndex;
      _auStack_38 = (Expr *)local_90.line;
      pos.line = local_90.startIndex;
      std::
      make_unique<pfederc::BodyExpr,pfederc::Lexer&,pfederc::Position&,std::vector<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::allocator<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>>,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,pfederc::ReturnControlType>
                ((Lexer *)this,(Position *)in_RSI->lexer,
                 (vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
                  *)auStack_38,&expr,(ReturnControlType *)local_60);
      bVar2 = true;
    }
    std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::~unique_ptr
              ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)local_60);
    if (bVar2) {
LAB_00133fae:
      std::
      vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
      ::~vector((vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
                 *)&expr);
      return (__uniq_ptr_data<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>,_true,_true>
             )(__uniq_ptr_data<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>,_true,_true>
               )this;
    }
  } while( true );
}

Assistant:

std::unique_ptr<BodyExpr> Parser::parseFunctionBody() noexcept {
  Position pos(lexer.getCurrentToken()->getPosition());
  bool err = false;
  Exprs exprs;
  while (*lexer.getCurrentToken() != TokenType::TOK_KW_RET
      && *lexer.getCurrentToken() != TokenType::TOK_STMT
      && *lexer.getCurrentToken() != TokenType::TOK_EOF
      && *lexer.getCurrentToken() != TokenType::TOK_KW_ELSE) {
    if (*lexer.getCurrentToken() == TokenType::TOK_EOL) {
      lexer.next();
      continue;
    }

    std::unique_ptr<Expr> expr(parseExpression());
    if (*lexer.getCurrentToken() != TokenType::TOK_STMT
        && *lexer.getCurrentToken() != TokenType::TOK_EOL) {
      generateError(std::make_unique<SyntaxError>(LVL_ERROR,
        SyntaxErrorCode::STX_ERR_EXPECTED_EOL, lexer.getCurrentToken()->getPosition()));
      skipToStmtEol();
      err = true;
    } else if (*lexer.getCurrentToken() == TokenType::TOK_STMT && expr) {
      pos = pos + expr->getPosition();
      // return expression without mentioning return ('expr' ';')
      return std::make_unique<BodyExpr>(lexer, pos,
          std::move(exprs), std::move(expr),
          ReturnControlType::RETURN);
    }

    expect(TokenType::TOK_EOL);

    if (!expr)
      err = true;
    else {
      pos = pos + expr->getPosition();
      exprs.push_back(std::move(expr));
    }
  }

  std::unique_ptr<Expr> returnExpr;
  ReturnControlType rct{ReturnControlType::NONE};
  if (*lexer.getCurrentToken() == TokenType::TOK_KW_RET
      || *lexer.getCurrentToken() == TokenType::TOK_KW_CTN
      || *lexer.getCurrentToken() == TokenType::TOK_KW_BRK) {
    switch (lexer.getCurrentToken()->getType()) {
    case TokenType::TOK_KW_RET:
      rct = ReturnControlType::RETURN;
      break;
    case TokenType::TOK_KW_CTN:
      rct = ReturnControlType::CONTINUE;
      break;
    case TokenType::TOK_KW_BRK:
      rct = ReturnControlType::BREAK;
      break;
    default:
      fatal(__FILE__, __LINE__, "Return control is neither ret, ctn or brk.");
      break;
    }

    pos = pos + lexer.getCurrentToken()->getPosition();
    lexer.next(); // eat return,ctn,brk

    if (rct == ReturnControlType::RETURN
        || (*lexer.getCurrentToken() != TokenType::TOK_EOF
            && *lexer.getCurrentToken() != TokenType::TOK_EOL
            && *lexer.getCurrentToken() != TokenType::TOK_STMT)) {
      returnExpr = parseExpression();
      if (returnExpr)
        pos = pos + returnExpr->getPosition();
      else
        err = true;
    }
  }

  skipEol();

  if (err)
    return nullptr;

  return std::make_unique<BodyExpr>(lexer,
    pos, std::move(exprs), std::move(returnExpr), rct);
}